

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Parse.cpp
# Opt level: O0

bool __thiscall Parser::IsSpecialName(Parser *this,IdentPtr pid)

{
  bool local_19;
  IdentPtr pid_local;
  Parser *this_local;
  
  local_19 = true;
  if ((((pid != (this->wellKnownPropertyPids)._this) &&
       (local_19 = true, pid != (this->wellKnownPropertyPids)._super)) &&
      (local_19 = true, pid != (this->wellKnownPropertyPids)._superConstructor)) &&
     (local_19 = true, pid != (this->wellKnownPropertyPids)._newTarget)) {
    local_19 = pid == (this->wellKnownPropertyPids)._importMeta;
  }
  return local_19;
}

Assistant:

bool Parser::IsSpecialName(IdentPtr pid)
{
    return pid == wellKnownPropertyPids._this ||
        pid == wellKnownPropertyPids._super ||
        pid == wellKnownPropertyPids._superConstructor ||
        pid == wellKnownPropertyPids._newTarget ||
        pid == wellKnownPropertyPids._importMeta;
}